

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O2

bool absl::lts_20250127::str_format_internal::FormatUntyped
               (FormatRawSinkImpl raw_sink,UntypedFormatSpecImpl format,
               Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  pointer pCVar1;
  bool bVar2;
  void *pvVar3;
  char *pcVar4;
  int *next_arg_00;
  FormatSinkImpl *pFVar5;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_03;
  size_t sVar6;
  pointer pCVar7;
  char *pcVar8;
  byte *end;
  byte *pbVar9;
  char *pcVar10;
  byte bVar11;
  string_view sVar12;
  string_view conv_string;
  string_view conv_string_00;
  string_view conv_string_01;
  string_view v;
  string_view v_00;
  string_view v_01;
  ConvTag tag;
  int next_arg;
  UnboundConversion conv;
  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
  local_480;
  ParsedFormatBase *local_468;
  UntypedFormatSpecImpl local_460;
  FormatSinkImpl sink;
  size_t extraout_RDX_02;
  
  local_460.size_ = format.size_;
  local_460.data_ = format.data_;
  sink.raw_.write_ = raw_sink.write_;
  sink.raw_.sink_ = raw_sink.sink_;
  sink.pos_ = sink.buf_;
  sink.size_ = 0;
  local_480.arg_context_.pack_.ptr_ = args.ptr_;
  local_480.arg_context_.pack_.len_ = args.len_;
  if (local_460.size_ == 0xffffffffffffffff) {
    local_468 = UntypedFormatSpecImpl::parsed_conversion(&local_460);
    pFVar5 = &sink;
    pcVar4 = (local_468->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    pCVar1 = (local_468->items_).
             super__Vector_base<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar10 = (char *)0x0;
    sVar6 = extraout_RDX_01;
    pcVar8 = pcVar4;
    local_480.converter_.sink_ = pFVar5;
    for (pCVar7 = (local_468->items_).
                  super__Vector_base<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
                  ._M_impl.super__Vector_impl_data._M_start; pCVar7 != pCVar1; pCVar7 = pCVar7 + 1)
    {
      pcVar8 = pcVar8 + (long)pcVar10;
      pcVar10 = pcVar4 + (pCVar7->text_end - (long)pcVar8);
      if (pCVar7->is_conversion == true) {
        conv_string_01._M_str = (char *)pFVar5;
        conv_string_01._M_len = sVar6;
        bVar2 = anon_unknown_3::
                ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
                ::ConvertOne(&local_480,&pCVar7->conv,conv_string_01);
        sVar6 = extraout_RDX_02;
        if (!bVar2) goto LAB_00309a99;
      }
      else {
        sVar12._M_str = pcVar8;
        sVar12._M_len = (size_t)pcVar10;
        FormatSinkImpl::Append(local_480.converter_.sink_,sVar12);
        sVar6 = extraout_RDX_03;
      }
    }
    bVar11 = local_468->has_error_ ^ 1;
  }
  else {
    sVar12 = UntypedFormatSpecImpl::str(&local_460);
    pbVar9 = (byte *)sVar12._M_str;
    local_480.converter_.sink_ = &sink;
    next_arg = 0;
    end = pbVar9 + sVar12._M_len;
    while( true ) {
      while( true ) {
        bVar11 = pbVar9 == end;
        if ((bool)bVar11) goto LAB_00309b33;
        pvVar3 = memchr(pbVar9,0x25,(long)end - (long)pbVar9);
        if (pvVar3 == (void *)0x0) {
          bVar11 = 1;
          v_01._M_str = (char *)pbVar9;
          v_01._M_len = (long)end - (long)pbVar9;
          FormatSinkImpl::Append(local_480.converter_.sink_,v_01);
          goto LAB_00309b33;
        }
        v._M_len = (long)pvVar3 - (long)pbVar9;
        v._M_str = (char *)pbVar9;
        FormatSinkImpl::Append(local_480.converter_.sink_,v);
        pbVar9 = (byte *)((long)pvVar3 + 1);
        if (end <= pbVar9) goto LAB_00309b33;
        tag.tag_ = ConvTagHolder::value[*pbVar9].tag_;
        pcVar4 = (char *)CONCAT71(0x451e,tag.tag_);
        if (-1 < (char)tag.tag_) break;
        if (*pbVar9 == 0x25) {
          v_00._M_str = "%";
          v_00._M_len = 1;
          FormatSinkImpl::Append(local_480.converter_.sink_,v_00);
          goto LAB_00309a4a;
        }
        conv.width.value_ = -1;
        conv.precision.value_ = -1;
        conv.flags = kBasic;
        conv.length_mod = none;
        conv.conv = v|s;
        next_arg_00 = &next_arg;
        pbVar9 = (byte *)ConsumeUnboundConversionNoInline
                                   ((char *)pbVar9,(char *)end,&conv,next_arg_00);
        if ((pbVar9 == (byte *)0x0) ||
           (conv_string_00._M_str = (char *)next_arg_00, conv_string_00._M_len = extraout_RDX_00,
           bVar2 = anon_unknown_3::
                   ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
                   ::ConvertOne(&local_480,&conv,conv_string_00), !bVar2)) goto LAB_00309a99;
      }
      if (next_arg < 0) break;
      conv.width.value_ = -1;
      conv.precision.value_ = -1;
      conv.flags = kBasic;
      conv.length_mod = none;
      conv.conv = v|s;
      conv.conv = ConvTag::as_conv(&tag);
      next_arg = next_arg + 1;
      conv_string._M_str = pcVar4;
      conv_string._M_len = extraout_RDX;
      conv.arg_position = next_arg;
      bVar2 = anon_unknown_3::
              ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
              ::ConvertOne(&local_480,&conv,conv_string);
      if (!bVar2) break;
LAB_00309a4a:
      pbVar9 = (byte *)((long)pvVar3 + 2);
    }
LAB_00309a99:
    bVar11 = 0;
  }
LAB_00309b33:
  FormatSinkImpl::~FormatSinkImpl(&sink);
  return (bool)bVar11;
}

Assistant:

bool FormatUntyped(FormatRawSinkImpl raw_sink,
                   const UntypedFormatSpecImpl format,
                   absl::Span<const FormatArgImpl> args) {
  FormatSinkImpl sink(raw_sink);
  using Converter = DefaultConverter;
  return ConvertAll(format, args, Converter(&sink));
}